

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

ly_set * ly_set_dup(ly_set *set)

{
  uint uVar1;
  ly_set *__ptr;
  lys_node **__dest;
  size_t __size;
  
  if (set != (ly_set *)0x0) {
    __ptr = (ly_set *)malloc(0x10);
    if (__ptr == (ly_set *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_set_dup");
      return (ly_set *)0x0;
    }
    __ptr->number = set->number;
    uVar1 = set->size;
    __ptr->size = uVar1;
    __size = (ulong)uVar1 << 3;
    __dest = (lys_node **)malloc(__size);
    (__ptr->set).s = __dest;
    if (__dest != (lys_node **)0x0) {
      memcpy(__dest,(set->set).s,__size);
      return __ptr;
    }
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_set_dup");
    free(__ptr);
  }
  return (ly_set *)0x0;
}

Assistant:

ly_set *
ly_set_dup(const struct ly_set *set)
{
    struct ly_set *new;

    if (!set) {
        return NULL;
    }

    new = malloc(sizeof *new);
    LY_CHECK_ERR_RETURN(!new, LOGMEM(NULL), NULL);
    new->number = set->number;
    new->size = set->size;
    new->set.g = malloc(new->size * sizeof *(new->set.g));
    LY_CHECK_ERR_RETURN(!new->set.g, LOGMEM(NULL); free(new), NULL);
    memcpy(new->set.g, set->set.g, new->size * sizeof *(new->set.g));

    return new;
}